

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O1

uint32_t bloaty::wasm::GetNumFunctionImports(Section *section)

{
  byte bVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  Nonnull<char_*> pcVar5;
  uint32_t uVar6;
  size_t size;
  Arg *in_R8;
  uint uVar7;
  string_view format;
  string_view data;
  string_view local_88;
  string local_70;
  long local_50;
  Nonnull<char_*> local_48;
  char local_40 [32];
  
  if (section->id != 2) {
    __assert_fail("section.id == Section::kImport",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/webassembly.cc"
                  ,0x10f,"uint32_t bloaty::wasm::GetNumFunctionImports(const Section &)");
  }
  local_88._M_len = (section->contents)._M_len;
  local_88._M_str = (section->contents)._M_str;
  uVar6 = 0;
  uVar2 = ReadLEB128Internal(false,0x20,&local_88);
  if ((int)uVar2 != 0) {
    uVar6 = 0;
    do {
      uVar3 = ReadLEB128Internal(false,0x20,&local_88);
      uVar4 = uVar3 & 0xffffffff;
      if (local_88._M_len < uVar4) {
LAB_0018fe1b:
        Throw("premature EOF reading variable-length DWARF data",0x47);
      }
      local_88._M_str = local_88._M_str + uVar4;
      local_88._M_len = local_88._M_len - uVar4;
      uVar3 = ReadLEB128Internal(false,0x20,&local_88);
      uVar4 = uVar3 & 0xffffffff;
      if (local_88._M_len < uVar4) goto LAB_0018fe1b;
      local_88._M_str = local_88._M_str + uVar4;
      local_88._M_len = local_88._M_len - uVar4;
      if (local_88._M_len == 0) {
        Throw("premature EOF reading fixed-length data",0x8d);
      }
      bVar1 = *local_88._M_str;
      local_88._M_str = (char *)((byte *)local_88._M_str + 1);
      local_88._M_len = local_88._M_len - 1;
      switch(bVar1) {
      case 0:
        uVar6 = uVar6 + 1;
        size = 0x20;
        break;
      case 1:
        ReadLEB128Internal(true,7,&local_88);
      case 2:
        ReadResizableLimits(&local_88);
        goto LAB_0018fe04;
      case 3:
        ReadLEB128Internal(true,7,&local_88);
        size = 1;
        break;
      default:
        pcVar5 = absl::numbers_internal::FastIntToBuffer((uint)bVar1,local_40);
        local_50 = (long)pcVar5 - (long)local_40;
        format._M_str = (char *)&local_50;
        format._M_len = (size_t)"Unrecognized import kind: $0";
        local_48 = local_40;
        absl::Substitute_abi_cxx11_(&local_70,(absl *)0x1c,format,in_R8);
        Throw(local_70._M_dataplus._M_p,299);
      }
      ReadLEB128Internal(false,size,&local_88);
LAB_0018fe04:
      uVar7 = (int)uVar2 - 1;
      uVar2 = (uint64_t)uVar7;
    } while (uVar7 != 0);
  }
  return uVar6;
}

Assistant:

uint32_t GetNumFunctionImports(const Section& section) {
  assert(section.id == Section::kImport);
  string_view data = section.contents;

  uint32_t count = ReadVarUInt32(&data);
  uint32_t func_count = 0;

  for (uint32_t i = 0; i < count; i++) {
    uint32_t module_len = ReadVarUInt32(&data);
    ReadPiece(module_len, &data);
    uint32_t field_len = ReadVarUInt32(&data);
    ReadPiece(field_len, &data);
    auto kind = ReadFixed<uint8_t>(&data);

    switch (kind) {
      case ExternalKind::kFunction:
        func_count++;
        ReadVarUInt32(&data);
        break;
      case ExternalKind::kTable:
        ReadTableType(&data);
        break;
      case ExternalKind::kMemory:
        ReadMemoryType(&data);
        break;
      case ExternalKind::kGlobal:
        ReadGlobalType(&data);
        break;
      default:
        THROWF("Unrecognized import kind: $0", kind);
    }
  }

  return func_count;
}